

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O0

Cut_Cut_t * Cut_CutMergeTwo(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Cut_Cut_t *pCVar4;
  int local_50;
  uint local_4c;
  int c;
  int k;
  int i;
  int nLeaves1;
  int nLeaves0;
  int Limit;
  int *pLeaves;
  Cut_Cut_t *pRes;
  Cut_Cut_t *pCut1_local;
  Cut_Cut_t *pCut0_local;
  Cut_Man_t *p_local;
  
  if (*(uint *)pCut0 >> 0x1c < *(uint *)pCut1 >> 0x1c) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutMerge.c"
                  ,0xb1,"Cut_Cut_t *Cut_CutMergeTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  uVar2 = *(uint *)pCut0 >> 0x1c;
  uVar3 = *(uint *)pCut1 >> 0x1c;
  uVar1 = p->pParams->nVarsMax;
  if ((uVar2 == uVar1) && (uVar3 == uVar1)) {
    for (c = 0; c < (int)uVar2; c = c + 1) {
      if (*(int *)(&pCut0[1].field_0x0 + (long)c * 4) != *(int *)(&pCut1[1].field_0x0 + (long)c * 4)
         ) {
        return (Cut_Cut_t *)0x0;
      }
    }
    p_local = (Cut_Man_t *)Cut_CutAlloc(p);
    for (c = 0; c < (int)uVar2; c = c + 1) {
      *(undefined4 *)((long)p_local->pStore0 + (long)c * 4 + -0x48) =
           *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
    }
    *(uint *)&p_local->pParams =
         *(uint *)&p_local->pParams & 0xfffffff | *(uint *)pCut0 & 0xf0000000;
  }
  else if (uVar2 == uVar1) {
    for (c = 0; local_4c = uVar2, c < (int)uVar3; c = c + 1) {
      do {
        local_4c = local_4c - 1;
        if ((int)local_4c < 0) break;
      } while (*(int *)(&pCut0[1].field_0x0 + (long)(int)local_4c * 4) !=
               *(int *)(&pCut1[1].field_0x0 + (long)c * 4));
      if (local_4c == 0xffffffff) {
        return (Cut_Cut_t *)0x0;
      }
    }
    p_local = (Cut_Man_t *)Cut_CutAlloc(p);
    for (c = 0; c < (int)uVar2; c = c + 1) {
      *(undefined4 *)((long)p_local->pStore0 + (long)c * 4 + -0x48) =
           *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
    }
    *(uint *)&p_local->pParams =
         *(uint *)&p_local->pParams & 0xfffffff | *(uint *)pCut0 & 0xf0000000;
  }
  else {
    if (p->pReady == (Cut_Cut_t *)0x0) {
      pCVar4 = Cut_CutAlloc(p);
      p->pReady = pCVar4;
    }
    pCVar4 = p->pReady;
    local_4c = 0;
    c = 0;
    for (local_50 = 0; local_50 < (int)uVar1; local_50 = local_50 + 1) {
      if (local_4c == uVar3) {
        if (c == uVar2) {
          *(uint *)p->pReady = *(uint *)p->pReady & 0xfffffff | local_50 << 0x1c;
          pCVar4 = p->pReady;
          p->pReady = (Cut_Cut_t *)0x0;
          return pCVar4;
        }
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
        c = c + 1;
      }
      else if (c == uVar2) {
        if (local_4c == uVar3) {
          *(uint *)p->pReady = *(uint *)p->pReady & 0xfffffff | local_50 << 0x1c;
          pCVar4 = p->pReady;
          p->pReady = (Cut_Cut_t *)0x0;
          return pCVar4;
        }
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4);
        local_4c = local_4c + 1;
      }
      else if (*(int *)(&pCut0[1].field_0x0 + (long)c * 4) <
               *(int *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4)) {
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
        c = c + 1;
      }
      else if (*(int *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4) <
               *(int *)(&pCut0[1].field_0x0 + (long)c * 4)) {
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4);
        local_4c = local_4c + 1;
      }
      else {
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
        local_4c = local_4c + 1;
        c = c + 1;
      }
    }
    if ((c < (int)uVar2) || ((int)local_4c < (int)uVar3)) {
      p_local = (Cut_Man_t *)0x0;
    }
    else {
      *(uint *)p->pReady = *(uint *)p->pReady & 0xfffffff | local_50 << 0x1c;
      p_local = (Cut_Man_t *)p->pReady;
      p->pReady = (Cut_Cut_t *)0x0;
    }
  }
  return (Cut_Cut_t *)p_local;
}

Assistant:

Cut_Cut_t * Cut_CutMergeTwo( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    Cut_Cut_t * pRes;
    int * pLeaves;
    int Limit, nLeaves0, nLeaves1;
    int i, k, c;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // consider two cuts
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;

    // the case of the largest cut sizes
    Limit = p->pParams->nVarsMax;
    if ( nLeaves0 == Limit && nLeaves1 == Limit )
    {
        for ( i = 0; i < nLeaves0; i++ )
            if ( pCut0->pLeaves[i] != pCut1->pLeaves[i] )
                return NULL;
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = pCut0->nLeaves;
        return pRes;
    }
    // the case when one of the cuts is the largest
    if ( nLeaves0 == Limit )
    {
        for ( i = 0; i < nLeaves1; i++ )
        {
            for ( k = nLeaves0 - 1; k >= 0; k-- )
                if ( pCut0->pLeaves[k] == pCut1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return NULL;
        }
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = pCut0->nLeaves;
        return pRes;
    }

    // prepare the cut
    if ( p->pReady == NULL )
        p->pReady = Cut_CutAlloc( p );
    pLeaves = p->pReady->pLeaves;

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < Limit; c++ )
    {
        if ( k == nLeaves1 )
        {
            if ( i == nLeaves0 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == nLeaves0 )
        {
            if ( k == nLeaves1 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    if ( i < nLeaves0 || k < nLeaves1 )
        return NULL;
    p->pReady->nLeaves = c;
    pRes = p->pReady;  p->pReady = NULL;
    return pRes;
}